

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O0

DdNode * Cudd_zddUnateProduct(DdManager *dd,DdNode *f,DdNode *g)

{
  DdNode *pDVar1;
  DdNode *res;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddZddUnateProduct(dd,f,g);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode  *
Cudd_zddUnateProduct(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode      *res;

    do {
        dd->reordered = 0;
        res = cuddZddUnateProduct(dd, f, g);
    } while (dd->reordered == 1);
    return(res);

}